

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::bindFramebuffer(ReferenceContext *this,deUint32 target,deUint32 name)

{
  int *piVar1;
  ObjectManager<sglr::rc::Framebuffer> *this_00;
  undefined8 *puVar2;
  Framebuffer *pFVar3;
  long lVar4;
  ulong uVar5;
  deUint32 name_1;
  int iVar6;
  bool bVar7;
  pair<unsigned_int,_sglr::rc::Framebuffer_*> local_40;
  
  if ((target - 0x8ca8 < 2) || (target == 0x8d40)) {
    if (name == 0) {
      pFVar3 = (Framebuffer *)0x0;
    }
    else {
      this_00 = &this->m_framebuffers;
      pFVar3 = rc::ObjectManager<sglr::rc::Framebuffer>::find(this_00,name);
      if (pFVar3 == (Framebuffer *)0x0) {
        pFVar3 = (Framebuffer *)operator_new(0x50);
        (pFVar3->super_NamedObject).m_name = name;
        (pFVar3->super_NamedObject).m_refCount = 1;
        (pFVar3->super_NamedObject)._vptr_NamedObject = (_func_int **)&PTR__Framebuffer_0079cca0;
        lVar4 = 0x20;
        do {
          puVar2 = (undefined8 *)((long)pFVar3->m_attachments + lVar4 + -0x20);
          *puVar2 = 2;
          puVar2[1] = 10;
          *(undefined4 *)((long)pFVar3->m_attachments + lVar4 + -0x10) = 0;
          lVar4 = lVar4 + 0x14;
        } while (lVar4 != 0x5c);
        if (this_00->m_lastName < name) {
          this_00->m_lastName = name;
        }
        local_40.first = name;
        local_40.second = pFVar3;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,sglr::rc::Framebuffer*>,std::_Select1st<std::pair<unsigned_int_const,sglr::rc::Framebuffer*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sglr::rc::Framebuffer*>>>
        ::_M_emplace_unique<std::pair<unsigned_int,sglr::rc::Framebuffer*>>
                  ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,sglr::rc::Framebuffer*>,std::_Select1st<std::pair<unsigned_int_const,sglr::rc::Framebuffer*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sglr::rc::Framebuffer*>>>
                    *)&(this->m_framebuffers).m_objects,&local_40);
      }
    }
    iVar6 = 0;
    do {
      if (target == 0x8d40 || (iVar6 == 0 ^ 0x8ca9) == target) {
        uVar5 = (ulong)(iVar6 != 0);
        if (*(long *)((this->m_clearColor).m_data + uVar5 * 2 + -0x1a) != 0) {
          lVar4 = 0x10;
          do {
            releaseFboAttachmentReference
                      (this,(Attachment *)
                            (*(long *)((this->m_clearColor).m_data + uVar5 * 2 + -0x1a) + lVar4));
            lVar4 = lVar4 + 0x14;
          } while (lVar4 != 0x4c);
          rc::ObjectManager<sglr::rc::Framebuffer>::releaseReference
                    (&this->m_framebuffers,
                     *(Framebuffer **)((this->m_clearColor).m_data + uVar5 * 2 + -0x1a));
        }
        if (pFVar3 != (Framebuffer *)0x0) {
          piVar1 = &(pFVar3->super_NamedObject).m_refCount;
          *piVar1 = *piVar1 + 1;
          lVar4 = 0;
          do {
            acquireFboAttachmentReference
                      (this,(Attachment *)((long)&pFVar3->m_attachments[0].type + lVar4));
            lVar4 = lVar4 + 0x14;
          } while (lVar4 != 0x3c);
        }
        *(Framebuffer **)((this->m_clearColor).m_data + uVar5 * 2 + -0x1a) = pFVar3;
      }
      bVar7 = iVar6 == 0;
      iVar6 = iVar6 + 1;
    } while (bVar7);
  }
  else if (this->m_lastError == 0) {
    this->m_lastError = 0x500;
  }
  return;
}

Assistant:

void ReferenceContext::bindFramebuffer (deUint32 target, deUint32 name)
{
	Framebuffer* fbo = DE_NULL;

	RC_IF_ERROR(target != GL_FRAMEBUFFER		&&
				target != GL_DRAW_FRAMEBUFFER	&&
				target != GL_READ_FRAMEBUFFER, GL_INVALID_ENUM, RC_RET_VOID);

	if (name != 0)
	{
		// Find or create framebuffer object.
		fbo = m_framebuffers.find(name);
		if (!fbo)
		{
			fbo = new Framebuffer(name);
			m_framebuffers.insert(fbo);
		}
	}

	for (int ndx = 0; ndx < 2; ndx++)
	{
		deUint32			bindingTarget	= ndx ? GL_DRAW_FRAMEBUFFER			: GL_READ_FRAMEBUFFER;
		rc::Framebuffer*&	binding			= ndx ? m_drawFramebufferBinding	: m_readFramebufferBinding;

		if (target != GL_FRAMEBUFFER && target != bindingTarget)
			continue; // Doesn't match this target.

		// Remove old references
		if (binding)
		{
			// Clear all attachment point references
			for (int point = 0; point < Framebuffer::ATTACHMENTPOINT_LAST; point++)
				releaseFboAttachmentReference(binding->getAttachment((Framebuffer::AttachmentPoint)point));

			m_framebuffers.releaseReference(binding);
		}

		// Create new references
		if (fbo)
		{
			m_framebuffers.acquireReference(fbo);

			for (int point = 0; point < Framebuffer::ATTACHMENTPOINT_LAST; point++)
				acquireFboAttachmentReference(fbo->getAttachment((Framebuffer::AttachmentPoint)point));
		}

		binding = fbo;
	}
}